

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_hmi_midiout.cpp
# Opt level: O2

DWORD * __thiscall
HMISong::SendCommand
          (HMISong *this,DWORD *events,TrackInfo *track,DWORD delay,ptrdiff_t room,
          bool *sysex_noroom)

{
  byte bVar1;
  BYTE BVar2;
  ulong uVar3;
  BYTE *pBVar4;
  DWORD DVar5;
  uint volume;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  DWORD *__dest;
  undefined1 *puVar10;
  undefined1 *puVar11;
  uint uVar12;
  size_t sVar13;
  AutoNoteOff off;
  AutoNoteOff local_38;
  
  if (this->FakeTrack == track) {
    NoteOffQueue::Pop(&this->NoteOffs,&local_38);
    *events = delay;
    events[1] = 0;
    events[2] = (ushort)local_38._4_2_ | 0x90;
    goto LAB_00359c41;
  }
  *sysex_noroom = false;
  uVar7 = track->TrackP;
  uVar3 = track->MaxTrackP;
  if (uVar3 <= uVar7) goto LAB_00359eb6;
  pBVar4 = track->TrackBegin;
  uVar6 = uVar7 + 1;
  track->TrackP = uVar6;
  if (uVar3 <= uVar6) goto LAB_00359eb6;
  bVar1 = pBVar4[uVar7];
  uVar8 = (uint)bVar1;
  *events = delay;
  events[1] = 0;
  events[2] = 0x2000000;
  if ((0xf < uVar8 - 0xf0) || ((0xc081U >> (uVar8 - 0xf0 & 0x1f) & 1) == 0)) {
    uVar12 = uVar8;
    if ((~uVar8 & 0xf0) == 0) {
      if (MIDI_CommonLengths[uVar8 & 0xf] < '\x01') {
        volume = 0;
        uVar9 = 0;
      }
      else {
        track->TrackP = uVar7 + 2;
        uVar9 = (uint)pBVar4[uVar7 + 1];
        if (MIDI_CommonLengths[uVar8 & 0xf] < '\x02') goto LAB_00359da9;
        uVar6 = uVar7 + 3;
        track->TrackP = uVar6;
        volume = (uint)pBVar4[uVar7 + 2];
      }
    }
    else if ((char)bVar1 < '\0') {
      track->RunningStatus = bVar1;
      track->TrackP = uVar7 + 2;
      uVar9 = (uint)pBVar4[uVar7 + 1];
LAB_00359da9:
      uVar6 = uVar7 + 2;
      volume = 0;
    }
    else {
      volume = 0;
      uVar12 = (uint)track->RunningStatus;
      uVar9 = uVar8;
    }
    if (uVar3 <= uVar6) {
LAB_00359eb6:
      track->Finished = true;
      return events;
    }
    uVar8 = uVar12 & 0x70;
    if (MIDI_EventLengths[uVar8 >> 4] == '\x02') {
      track->TrackP = uVar6 + 1;
      volume = (uint)pBVar4[uVar6];
    }
    if ((uVar8 == 0x30) && ((BYTE)uVar9 == '\a')) {
      volume = MIDIStreamer::VolumeControllerChange(&this->super_MIDIStreamer,uVar12 & 0xf,volume);
    }
    if ((byte)uVar12 != 0xff) {
      events[2] = (volume & 0xff) << 0x10 | uVar9 << 8 | uVar12;
    }
    if ((uVar8 == 0x10) && (this->ReadVarLen == ReadVarLenHMI)) {
      DVar5 = TrackInfo::ReadVarLenHMI(track);
      NoteOffQueue::AddNoteOff(&this->NoteOffs,DVar5,(byte)uVar12 & 0xf,(BYTE)uVar9);
    }
    goto LAB_00359f16;
  }
  if (uVar8 == 0xf0) {
LAB_00359bbb:
    DVar5 = (*this->ReadVarLen)(track);
    if ((DVar5 < 0x5f4) && ((this->super_MIDIStreamer).DeviceType != MDEV_SNDSYS)) {
      if ((ulong)(room << 2) <= (ulong)(DVar5 + 0xc)) {
        track->TrackP = uVar7;
        *sysex_noroom = true;
        return events;
      }
      if (bVar1 == 0xf0) {
        uVar8 = DVar5 + 0x80000001;
        __dest = (DWORD *)((long)events + 0xd);
        *(undefined1 *)(events + 3) = 0xf0;
      }
      else {
        __dest = events + 3;
        uVar8 = DVar5 | 0x80000000;
      }
      events[2] = uVar8;
      uVar7 = (ulong)DVar5;
      memcpy(__dest,track->TrackBegin + track->TrackP,uVar7);
      puVar10 = (undefined1 *)((long)__dest + uVar7);
      for (puVar11 = puVar10; ((ulong)puVar11 & 3) != 0; puVar11 = puVar11 + 1) {
        *puVar10 = 0;
        puVar10 = puVar10 + 1;
      }
      track->TrackP = track->TrackP + uVar7;
    }
    else {
      track->TrackP = track->TrackP + (ulong)DVar5;
    }
    goto LAB_00359f16;
  }
  if (uVar8 == 0xff) {
    track->TrackP = uVar7 + 2;
    if (uVar3 <= uVar7 + 2) goto LAB_00359eb6;
    BVar2 = pBVar4[uVar7 + 1];
    DVar5 = (*this->ReadVarLen)(track);
    uVar7 = track->TrackP;
    uVar3 = track->MaxTrackP;
    if (uVar3 <= uVar7) goto LAB_00359eb6;
    uVar6 = DVar5 + uVar7;
    if (uVar3 < uVar6) {
      track->Finished = true;
    }
    else {
      if (BVar2 == 'Q') {
        pBVar4 = track->TrackBegin;
        (this->super_MIDIStreamer).Tempo =
             (uint)pBVar4[uVar7 + 2] | (uint)pBVar4[uVar7 + 1] << 8 | (uint)pBVar4[uVar7] << 0x10;
        *events = delay;
        events[1] = 0;
        events[2] = (this->super_MIDIStreamer).Tempo | 0x1000000;
      }
      else if (BVar2 == '/') {
        track->Finished = true;
      }
      track->TrackP = uVar6;
      if (uVar6 == uVar3) goto switchD_00359d1f_caseD_11;
    }
    goto LAB_00359f16;
  }
  if (uVar8 != 0xfe) {
    if (uVar8 == 0xf7) goto LAB_00359bbb;
    goto LAB_00359f16;
  }
  track->TrackP = uVar7 + 2;
  if (uVar3 <= uVar7 + 2) goto LAB_00359eb6;
  switch(pBVar4[uVar6]) {
  case '\x10':
    track->TrackP = uVar7 + 4;
    if ((uVar3 <= uVar7 + 4) ||
       (uVar7 = pBVar4[uVar7 + 4] + uVar7 + 9, track->TrackP = uVar7, uVar3 <= uVar7))
    goto LAB_00359eb6;
    break;
  default:
switchD_00359d1f_caseD_11:
    track->Finished = true;
    break;
  case '\x12':
  case '\x14':
    sVar13 = uVar7 + 4;
    goto LAB_00359e74;
  case '\x13':
  case '\x15':
    sVar13 = uVar7 + 8;
LAB_00359e74:
    track->TrackP = sVar13;
  }
LAB_00359f16:
  if (track->Finished == false) {
    DVar5 = (*this->ReadVarLen)(track);
    track->Delay = DVar5;
  }
  if ((events[2] & 0xff000000) != 0x2000000 || *events != 0) {
LAB_00359c41:
    events = events + 3;
  }
  return events;
}

Assistant:

DWORD *HMISong::SendCommand (DWORD *events, TrackInfo *track, DWORD delay, ptrdiff_t room, bool &sysex_noroom)
{
	DWORD len;
	BYTE event, data1 = 0, data2 = 0;

	// If the next event comes from the fake track, pop an entry off the note-off queue.
	if (track == FakeTrack)
	{
		AutoNoteOff off;
		NoteOffs.Pop(off);
		events[0] = delay;
		events[1] = 0;
		events[2] = MIDI_NOTEON | off.Channel | (off.Key << 8);
		return events + 3;
	}

	sysex_noroom = false;
	size_t start_p = track->TrackP;

	CHECK_FINISHED
	event = track->TrackBegin[track->TrackP++];
	CHECK_FINISHED

	// The actual event type will be filled in below. If it's not a NOP,
	// the events pointer will be advanced once the actual event is written.
	// Otherwise, we do it at the end of the function.
	events[0] = delay;
	events[1] = 0;
	events[2] = MEVT_NOP << 24;

	if (event != MIDI_SYSEX && event != MIDI_META && event != MIDI_SYSEXEND && event != 0xFe)
	{
		// Normal short message
		if ((event & 0xF0) == 0xF0)
		{
			if (MIDI_CommonLengths[event & 15] > 0)
			{
				data1 = track->TrackBegin[track->TrackP++];
				if (MIDI_CommonLengths[event & 15] > 1)
				{
					data2 = track->TrackBegin[track->TrackP++];
				}
			}
		}
		else if ((event & 0x80) == 0)
		{
			data1 = event;
			event = track->RunningStatus;
		}
		else
		{
			track->RunningStatus = event;
			data1 = track->TrackBegin[track->TrackP++];
		}

		CHECK_FINISHED

		if (MIDI_EventLengths[(event&0x70)>>4] == 2)
		{
			data2 = track->TrackBegin[track->TrackP++];
		}

		// Monitor channel volume controller changes.
		if ((event & 0x70) == (MIDI_CTRLCHANGE & 0x70) && data1 == 7)
		{
			data2 = VolumeControllerChange(event & 15, data2);
		}

		if (event != MIDI_META)
		{
			events[2] = event | (data1<<8) | (data2<<16);
		}

		if (ReadVarLen == ReadVarLenHMI && (event & 0x70) == (MIDI_NOTEON & 0x70))
		{ // HMI note on events include the time until an implied note off event.
			NoteOffs.AddNoteOff(track->ReadVarLenHMI(), event & 0x0F, data1);
		}
	}
	else
	{
		// SysEx events could potentially not have enough room in the buffer...
		if (event == MIDI_SYSEX || event == MIDI_SYSEXEND)
		{
			len = ReadVarLen(track);
			if (len >= (MAX_EVENTS-1)*3*4 || DeviceType == MDEV_SNDSYS)
			{ // This message will never fit. Throw it away.
				track->TrackP += len;
			}
			else if (len + 12 >= (size_t)room * 4)
			{ // Not enough room left in this buffer. Backup and wait for the next one.
				track->TrackP = start_p;
				sysex_noroom = true;
				return events;
			}
			else
			{
				BYTE *msg = (BYTE *)&events[3];
				if (event == MIDI_SYSEX)
				{ // Need to add the SysEx marker to the message.
					events[2] = (MEVT_LONGMSG << 24) | (len + 1);
					*msg++ = MIDI_SYSEX;
				}
				else
				{
					events[2] = (MEVT_LONGMSG << 24) | len;
				}
				memcpy(msg, &track->TrackBegin[track->TrackP], len);
				msg += len;
				// Must pad with 0
				while ((size_t)msg & 3)
				{
					*msg++ = 0;
				}
				track->TrackP += len;
			}
		}
		else if (event == MIDI_META)
		{
			// It's a meta-event
			event = track->TrackBegin[track->TrackP++];
			CHECK_FINISHED
			len = ReadVarLen(track);
			CHECK_FINISHED

			if (track->TrackP + len <= track->MaxTrackP)
			{
				switch (event)
				{
				case MIDI_META_EOT:
					track->Finished = true;
					break;

				case MIDI_META_TEMPO:
					Tempo =
						(track->TrackBegin[track->TrackP+0]<<16) |
						(track->TrackBegin[track->TrackP+1]<<8)  |
						(track->TrackBegin[track->TrackP+2]);
					events[0] = delay;
					events[1] = 0;
					events[2] = (MEVT_TEMPO << 24) | Tempo;
					break;
				}
				track->TrackP += len;
				if (track->TrackP == track->MaxTrackP)
				{
					track->Finished = true;
				}
			}
			else
			{
				track->Finished = true;
			}
		}
		else if (event == 0xFE)
		{ // Skip unknown HMI events.
			event = track->TrackBegin[track->TrackP++];
			CHECK_FINISHED
			if (event == 0x13 || event == 0x15)
			{
				track->TrackP += 6;
			}
			else if (event == 0x12 || event == 0x14)
			{
				track->TrackP += 2;
			}
			else if (event == 0x10)
			{
				track->TrackP += 2;
				CHECK_FINISHED
				track->TrackP += track->TrackBegin[track->TrackP] + 5;
				CHECK_FINISHED
			}
			else
			{ // No idea.
				track->Finished = true;
			}
		}